

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lode_png_test_bitreader(uchar *data,size_t size,size_t numsteps,size_t *steps,uint *result)

{
  ulong nbits;
  uint uVar1;
  uint local_7c;
  uint ok;
  size_t step;
  undefined1 local_68 [4];
  uint error;
  LodePNGBitReader reader;
  size_t i;
  uint *result_local;
  size_t *steps_local;
  size_t numsteps_local;
  size_t size_local;
  uchar *data_local;
  
  uVar1 = LodePNGBitReader_init((LodePNGBitReader *)local_68,data,size);
  if (uVar1 == 0) {
    reader.buffer = 0;
    reader._36_4_ = 0;
    for (; (ulong)reader._32_8_ < numsteps; reader._32_8_ = reader._32_8_ + 1) {
      nbits = steps[reader._32_8_];
      if (nbits < 0x1a) {
        if (nbits < 0x12) {
          if (nbits < 10) {
            local_7c = ensureBits9((LodePNGBitReader *)local_68,nbits);
          }
          else {
            local_7c = ensureBits17((LodePNGBitReader *)local_68,nbits);
          }
        }
        else {
          local_7c = ensureBits25((LodePNGBitReader *)local_68,nbits);
        }
      }
      else {
        local_7c = ensureBits32((LodePNGBitReader *)local_68,nbits);
      }
      if (local_7c == 0) {
        return 0;
      }
      uVar1 = readBits((LodePNGBitReader *)local_68,nbits);
      result[reader._32_8_] = uVar1;
    }
    data_local._4_4_ = 1;
  }
  else {
    data_local._4_4_ = 0;
  }
  return data_local._4_4_;
}

Assistant:

unsigned lode_png_test_bitreader(const unsigned char* data, size_t size,
                                 size_t numsteps, const size_t* steps, unsigned* result) {
  size_t i;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, data, size);
  if(error) return 0;
  for(i = 0; i < numsteps; i++) {
    size_t step = steps[i];
    unsigned ok;
    if(step > 25) ok = ensureBits32(&reader, step);
    else if(step > 17) ok = ensureBits25(&reader, step);
    else if(step > 9) ok = ensureBits17(&reader, step);
    else ok = ensureBits9(&reader, step);
    if(!ok) return 0;
    result[i] = readBits(&reader, step);
  }
  return 1;
}